

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall
QBoxLayout::insertWidget(QBoxLayout *this,int index,QWidget *widget,int stretch,Alignment alignment)

{
  long lVar1;
  bool bVar2;
  QBoxLayoutPrivate *w;
  QWidgetItem *it_00;
  QBoxLayoutItem *this_00;
  int in_ECX;
  QLayoutPrivate *in_RDX;
  QLayout *in_RDI;
  long in_FS_OFFSET;
  QBoxLayoutItem *it;
  QWidgetItem *b;
  QBoxLayoutPrivate *d;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w = d_func((QBoxLayout *)0x2f56fc);
  bVar2 = QLayoutPrivate::checkWidget(in_RDX,(QWidget *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0));
  if (bVar2) {
    QLayout::addChildWidget((QLayout *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),(QWidget *)w);
    QBoxLayoutPrivate::validateIndex
              ((QBoxLayoutPrivate *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
               (int)((ulong)w >> 0x20));
    it_00 = QLayoutPrivate::createWidgetItem(in_RDI,in_stack_ffffffffffffffa0);
    QLayoutItem::setAlignment((QLayoutItem *)0x2f5764,(Alignment)in_stack_ffffffffffffff9c.i);
    this_00 = (QBoxLayoutItem *)operator_new(0x10);
    QBoxLayoutItem::QBoxLayoutItem(this_00,&it_00->super_QLayoutItem,in_ECX);
    QList<QBoxLayoutItem_*>::insert((QList<QBoxLayoutItem_*> *)in_RDI,(qsizetype)this_00,this_00);
    (**(code **)(*(long *)in_RDI + 0x70))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBoxLayout::insertWidget(int index, QWidget *widget, int stretch,
                              Qt::Alignment alignment)
{
    Q_D(QBoxLayout);
    if (!d->checkWidget(widget))
         return;
    addChildWidget(widget);
    index = d->validateIndex(index);
    QWidgetItem *b = QLayoutPrivate::createWidgetItem(this, widget);
    b->setAlignment(alignment);

    QBoxLayoutItem *it = new QBoxLayoutItem(b, stretch);
    d->list.insert(index, it);
    invalidate();
}